

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

int __thiscall cmCPackGenerator::DoPackage(cmCPackGenerator *this)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  size_type sVar6;
  reference filename;
  char *local_1d20;
  char *local_1d08;
  char *local_1ce0;
  char *local_1cc8;
  char *local_1c50;
  char *local_1bd8;
  string local_1a98 [32];
  undefined1 local_1a78 [8];
  ostringstream cmCPackLog_msg_14;
  string local_1900 [32];
  undefined1 local_18e0 [8];
  ostringstream cmCPackLog_msg_13;
  string local_1768 [32];
  undefined1 local_1748 [8];
  ostringstream cmCPackLog_msg_12;
  char *packageFileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15a8;
  allocator local_1582;
  allocator local_1581;
  string local_1580;
  string local_1560 [8];
  string tmpPF;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1530;
  iterator it;
  undefined1 local_1508 [8];
  ostringstream cmCPackLog_msg_11;
  string local_1390 [32];
  undefined1 local_1370 [8];
  ostringstream cmCPackLog_msg_10;
  allocator local_11f1;
  value_type local_11f0;
  allocator local_11c9;
  string local_11c8;
  allocator local_11a1;
  string local_11a0;
  allocator local_1179;
  string local_1178;
  string local_1158 [32];
  undefined1 local_1138 [8];
  ostringstream cmCPackLog_msg_9;
  string local_fc0 [32];
  undefined1 local_fa0 [8];
  ostringstream cmCPackLog_msg_8;
  string local_e28 [32];
  undefined1 local_e08 [8];
  ostringstream cmCPackLog_msg_7;
  string local_c88 [32];
  undefined1 local_c68 [8];
  ostringstream cmCPackLog_msg_6;
  allocator local_ae9;
  undefined1 local_ae8 [8];
  string findExpr;
  Glob gl;
  ostringstream local_a50 [8];
  ostringstream cmCPackLog_msg_5;
  allocator local_8d1;
  string local_8d0;
  char *local_8b0;
  char *tempDirectory;
  string local_8a0;
  char *local_880;
  char *tempPackageFileName;
  ostringstream local_858 [8];
  ostringstream cmCPackLog_msg_4;
  string local_6e0 [32];
  ostringstream local_6c0 [8];
  ostringstream cmCPackLog_msg_3;
  string local_548 [32];
  ostringstream local_528 [8];
  ostringstream cmCPackLog_msg_2;
  string local_3b0 [32];
  ostringstream local_390 [8];
  ostringstream cmCPackLog_msg_1;
  allocator local_211;
  string local_210;
  char *local_1f0;
  char *toplevelDirectory;
  string local_1e0;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream cmCPackLog_msg;
  cmCPackGenerator *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar4 = std::operator<<((ostream *)local_190,"Create package using ");
  poVar4 = std::operator<<(poVar4,(string *)&this->Name);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->Logger;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x3fc,pcVar5);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  iVar3 = PrepareNames(this);
  if (iVar3 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    iVar3 = (*(this->super_cmObject)._vptr_cmObject[7])();
    if (iVar3 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1e0,"CPACK_REMOVE_TOPLEVEL_DIRECTORY",
                 (allocator *)((long)&toplevelDirectory + 7));
      pcVar5 = GetOption(this,&local_1e0);
      bVar2 = cmSystemTools::IsOn(pcVar5);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&toplevelDirectory + 7));
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_210,"CPACK_TOPLEVEL_DIRECTORY",&local_211);
        pcVar5 = GetOption(this,&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        std::allocator<char>::~allocator((allocator<char> *)&local_211);
        local_1f0 = pcVar5;
        bVar2 = cmsys::SystemTools::FileExists(pcVar5);
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream(local_390);
          poVar4 = std::operator<<((ostream *)local_390,"Remove toplevel directory: ");
          poVar4 = std::operator<<(poVar4,local_1f0);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->Logger;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x414,pcVar5);
          std::__cxx11::string::~string(local_3b0);
          std::__cxx11::ostringstream::~ostringstream(local_390);
          bVar2 = cmSystemTools::RepeatedRemoveDirectory(local_1f0);
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream(local_528);
            poVar4 = std::operator<<((ostream *)local_528,"Problem removing toplevel directory: ");
            poVar4 = std::operator<<(poVar4,local_1f0);
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            pcVar1 = this->Logger;
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x41a,pcVar5);
            std::__cxx11::string::~string(local_548);
            std::__cxx11::ostringstream::~ostringstream(local_528);
            return 0;
          }
        }
      }
      std::__cxx11::ostringstream::ostringstream(local_6c0);
      poVar4 = std::operator<<((ostream *)local_6c0,"About to install project ");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x420,pcVar5);
      std::__cxx11::string::~string(local_6e0);
      std::__cxx11::ostringstream::~ostringstream(local_6c0);
      iVar3 = InstallProject(this);
      if (iVar3 == 0) {
        this_local._4_4_ = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_858);
        poVar4 = std::operator<<((ostream *)local_858,"Done install project ");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x427,pcVar5);
        std::__cxx11::string::~string((string *)&tempPackageFileName);
        std::__cxx11::ostringstream::~ostringstream(local_858);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_8a0,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",
                   (allocator *)((long)&tempDirectory + 7));
        pcVar5 = GetOption(this,&local_8a0);
        std::__cxx11::string::~string((string *)&local_8a0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&tempDirectory + 7));
        local_880 = pcVar5;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_8d0,"CPACK_TEMPORARY_DIRECTORY",&local_8d1);
        pcVar5 = GetOption(this,&local_8d0);
        std::__cxx11::string::~string((string *)&local_8d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
        local_8b0 = pcVar5;
        std::__cxx11::ostringstream::ostringstream(local_a50);
        poVar4 = std::operator<<((ostream *)local_a50,"Find files");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x42e,pcVar5);
        std::__cxx11::string::~string((string *)&gl.ListDirs);
        std::__cxx11::ostringstream::~ostringstream(local_a50);
        cmsys::Glob::Glob((Glob *)((long)&findExpr.field_2 + 8));
        pcVar5 = local_8b0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_ae8,pcVar5,&local_ae9);
        std::allocator<char>::~allocator((allocator<char> *)&local_ae9);
        std::__cxx11::string::operator+=((string *)local_ae8,"/*");
        cmsys::Glob::RecurseOn((Glob *)((long)&findExpr.field_2 + 8));
        cmsys::Glob::SetRecurseThroughSymlinks((Glob *)((long)&findExpr.field_2 + 8),false);
        bVar2 = cmsys::Glob::FindFiles
                          ((Glob *)((long)&findExpr.field_2 + 8),(string *)local_ae8,
                           (GlobMessages *)0x0);
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e08);
          poVar4 = std::operator<<((ostream *)local_e08,"Create package");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->Logger;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x43b,pcVar5);
          std::__cxx11::string::~string(local_e28);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e08);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_fa0);
          poVar4 = std::operator<<((ostream *)local_fa0,"Package files to: ");
          if (local_880 == (char *)0x0) {
            local_1bd8 = "(NULL)";
          }
          else {
            local_1bd8 = local_880;
          }
          poVar4 = std::operator<<(poVar4,local_1bd8);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->Logger;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x43d,pcVar5);
          std::__cxx11::string::~string(local_fc0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_fa0);
          bVar2 = cmsys::SystemTools::FileExists(local_880);
          if (bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1138);
            poVar4 = std::operator<<((ostream *)local_1138,"Remove old package file");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            pcVar1 = this->Logger;
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,2,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x441,pcVar5);
            std::__cxx11::string::~string(local_1158);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1138);
            pcVar5 = local_880;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1178,pcVar5,&local_1179);
            cmsys::SystemTools::RemoveFile(&local_1178);
            std::__cxx11::string::~string((string *)&local_1178);
            std::allocator<char>::~allocator((allocator<char> *)&local_1179);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_11a0,"CPACK_INCLUDE_TOPLEVEL_DIRECTORY",&local_11a1);
          pcVar5 = GetOption(this,&local_11a0);
          bVar2 = cmSystemTools::IsOn(pcVar5);
          std::__cxx11::string::~string((string *)&local_11a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_11a1);
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_11c8,"CPACK_TOPLEVEL_DIRECTORY",&local_11c9);
            local_8b0 = GetOption(this,&local_11c8);
            std::__cxx11::string::~string((string *)&local_11c8);
            std::allocator<char>::~allocator((allocator<char> *)&local_11c9);
          }
          __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)((long)&findExpr.field_2 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&this->files,__x);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&this->packageFileNames);
          if (local_880 == (char *)0x0) {
            local_1c50 = "";
          }
          else {
            local_1c50 = local_880;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_11f0,local_1c50,&local_11f1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->packageFileNames,&local_11f0);
          std::__cxx11::string::~string((string *)&local_11f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_11f1);
          std::__cxx11::string::operator=((string *)&this->toplevel,local_8b0);
          iVar3 = (*(this->super_cmObject)._vptr_cmObject[10])();
          if ((iVar3 == 0) || (bVar2 = cmSystemTools::GetErrorOccuredFlag(), bVar2)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1370);
            poVar4 = std::operator<<((ostream *)local_1370,"Problem compressing the directory");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            pcVar1 = this->Logger;
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x458,pcVar5);
            std::__cxx11::string::~string(local_1390);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1370);
            this_local._4_4_ = 0;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1508);
            poVar4 = std::operator<<((ostream *)local_1508,"Copying final package(s) [");
            sVar6 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&this->packageFileNames);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar6);
            poVar4 = std::operator<<(poVar4,"]:");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            pcVar1 = this->Logger;
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,2,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x464,pcVar5);
            std::__cxx11::string::~string((string *)&it);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1508);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::__normal_iterator(&local_1530);
            local_1530._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this->packageFileNames);
            while( true ) {
              tmpPF.field_2._8_8_ =
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(&this->packageFileNames);
              bVar2 = __gnu_cxx::operator!=
                                (&local_1530,
                                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&tmpPF.field_2 + 8));
              if (!bVar2) break;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_1580,"CPACK_OUTPUT_FILE_PREFIX",&local_1581);
              pcVar5 = GetOption(this,&local_1580);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1560,pcVar5,&local_1582);
              std::allocator<char>::~allocator((allocator<char> *)&local_1582);
              std::__cxx11::string::~string((string *)&local_1580);
              std::allocator<char>::~allocator((allocator<char> *)&local_1581);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator->(&local_1530);
              local_880 = (char *)std::__cxx11::string::c_str();
              filename = __gnu_cxx::
                         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&local_1530);
              cmsys::SystemTools::GetFilenameName((string *)&packageFileName,filename);
              std::operator+(&local_15a8,"/",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &packageFileName);
              std::__cxx11::string::operator+=(local_1560,(string *)&local_15a8);
              std::__cxx11::string::~string((string *)&local_15a8);
              std::__cxx11::string::~string((string *)&packageFileName);
              local_1d20 = (char *)std::__cxx11::string::c_str();
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1748);
              poVar4 = std::operator<<((ostream *)local_1748,"Copy final package(s): ");
              if (local_880 == (char *)0x0) {
                local_1cc8 = "(NULL)";
              }
              else {
                local_1cc8 = local_880;
              }
              poVar4 = std::operator<<(poVar4,local_1cc8);
              poVar4 = std::operator<<(poVar4," to ");
              local_1ce0 = local_1d20;
              if (local_1d20 == (char *)0x0) {
                local_1ce0 = "(NULL)";
              }
              poVar4 = std::operator<<(poVar4,local_1ce0);
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              pcVar1 = this->Logger;
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              cmCPackLog::Log(pcVar1,4,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x471,pcVar5);
              std::__cxx11::string::~string(local_1768);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1748);
              bVar2 = cmSystemTools::CopyFileIfDifferent(local_880,local_1d20);
              if (bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a78);
                poVar4 = std::operator<<((ostream *)local_1a78,"- package: ");
                poVar4 = std::operator<<(poVar4,local_1d20);
                poVar4 = std::operator<<(poVar4," generated.");
                std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                pcVar1 = this->Logger;
                std::__cxx11::ostringstream::str();
                pcVar5 = (char *)std::__cxx11::string::c_str();
                cmCPackLog::Log(pcVar1,1,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x47e,pcVar5);
                std::__cxx11::string::~string(local_1a98);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a78);
                bVar2 = false;
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_18e0);
                poVar4 = std::operator<<((ostream *)local_18e0,"Problem copying the package: ");
                if (local_880 == (char *)0x0) {
                  local_1d08 = "(NULL)";
                }
                else {
                  local_1d08 = local_880;
                }
                poVar4 = std::operator<<(poVar4,local_1d08);
                poVar4 = std::operator<<(poVar4," to ");
                if (local_1d20 == (char *)0x0) {
                  local_1d20 = "(NULL)";
                }
                poVar4 = std::operator<<(poVar4,local_1d20);
                std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                pcVar1 = this->Logger;
                std::__cxx11::ostringstream::str();
                pcVar5 = (char *)std::__cxx11::string::c_str();
                cmCPackLog::Log(pcVar1,0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x479,pcVar5);
                std::__cxx11::string::~string(local_1900);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_18e0);
                this_local._4_4_ = 0;
                bVar2 = true;
              }
              std::__cxx11::string::~string(local_1560);
              if (bVar2) goto LAB_00479869;
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_1530);
            }
            this_local._4_4_ = 1;
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c68);
          poVar4 = std::operator<<((ostream *)local_c68,
                                   "Cannot find any files in the packaging tree");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->Logger;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x437,pcVar5);
          std::__cxx11::string::~string(local_c88);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c68);
          this_local._4_4_ = 0;
        }
LAB_00479869:
        std::__cxx11::string::~string((string *)local_ae8);
        cmsys::Glob::~Glob((Glob *)((long)&findExpr.field_2 + 8));
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int cmCPackGenerator::DoPackage()
{
  cmCPackLogger(cmCPackLog::LOG_OUTPUT,
    "Create package using " << this->Name << std::endl);

  // Prepare CPack internal name and check
  // values for many CPACK_xxx vars
  if ( !this->PrepareNames() )
    {
    return 0;
    }

  // Digest Component grouping specification
  if ( !this->PrepareGroupingKind() )
    {
    return 0;
    }

  if ( cmSystemTools::IsOn(
      this->GetOption("CPACK_REMOVE_TOPLEVEL_DIRECTORY")) )
    {
    const char* toplevelDirectory
      = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    if ( cmSystemTools::FileExists(toplevelDirectory) )
      {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Remove toplevel directory: "
        << toplevelDirectory << std::endl);
      if ( !cmSystemTools::RepeatedRemoveDirectory(toplevelDirectory) )
        {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
          "Problem removing toplevel directory: "
          << toplevelDirectory
          << std::endl);
        return 0;
        }
      }
    }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "About to install project " << std::endl);

  if ( !this->InstallProject() )
    {
    return 0;
    }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Done install project " << std::endl);


  const char* tempPackageFileName = this->GetOption(
    "CPACK_TEMPORARY_PACKAGE_FILE_NAME");
  const char* tempDirectory = this->GetOption("CPACK_TEMPORARY_DIRECTORY");

  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Find files" << std::endl);
  cmsys::Glob gl;
  std::string findExpr = tempDirectory;
  findExpr += "/*";
  gl.RecurseOn();
  gl.SetRecurseThroughSymlinks(false);
  if ( !gl.FindFiles(findExpr) )
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
      "Cannot find any files in the packaging tree" << std::endl);
    return 0;
    }

  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "Create package" << std::endl);
  cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Package files to: "
    << (tempPackageFileName ? tempPackageFileName : "(NULL)") << std::endl);
  if ( cmSystemTools::FileExists(tempPackageFileName) )
    {
    cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Remove old package file"
      << std::endl);
    cmSystemTools::RemoveFile(tempPackageFileName);
    }
  if ( cmSystemTools::IsOn(this->GetOption(
        "CPACK_INCLUDE_TOPLEVEL_DIRECTORY")) )
    {
    tempDirectory = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    }

  // The files to be installed
  files = gl.GetFiles();

  packageFileNames.clear();
  /* Put at least one file name into the list of
   * wanted packageFileNames. The specific generator
   * may update this during PackageFiles.
   * (either putting several names or updating the provided one)
   */
  packageFileNames.push_back(tempPackageFileName ? tempPackageFileName : "");
  toplevel = tempDirectory;
  if ( !this->PackageFiles() || cmSystemTools::GetErrorOccuredFlag())
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem compressing the directory"
      << std::endl);
    return 0;
    }

  /*
   * Copy the generated packages to final destination
   *  - there may be several of them
   *  - the initially provided name may have changed
   *    (because the specific generator did 'normalize' it)
   */
  cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Copying final package(s) ["
                   <<packageFileNames.size()
                   <<"]:"<<std::endl);
  std::vector<std::string>::iterator it;
  /* now copy package one by one */
  for (it=packageFileNames.begin();it!=packageFileNames.end();++it)
    {
    std::string tmpPF(this->GetOption("CPACK_OUTPUT_FILE_PREFIX"));
    tempPackageFileName = it->c_str();
    tmpPF += "/"+cmSystemTools::GetFilenameName(*it);
    const char* packageFileName = tmpPF.c_str();
    cmCPackLogger(cmCPackLog::LOG_DEBUG, "Copy final package(s): "
        << (tempPackageFileName ? tempPackageFileName : "(NULL)" )
        << " to "
        << (packageFileName ? packageFileName : "(NULL)")
        << std::endl);
    if ( !cmSystemTools::CopyFileIfDifferent(tempPackageFileName,
        packageFileName) )
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem copying the package: "
          << (tempPackageFileName ? tempPackageFileName : "(NULL)" )
          << " to "
          << (packageFileName ? packageFileName : "(NULL)")
          << std::endl);
      return 0;
      }
    cmCPackLogger(cmCPackLog::LOG_OUTPUT, "- package: "
        << packageFileName
        << " generated." << std::endl);
    }

  return 1;
}